

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorOr.h
# Opt level: O2

void __thiscall
llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
moveConstruct<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
           *this,ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                 *Other)

{
  MemoryBuffer *pMVar1;
  error_code *peVar2;
  storage_type *psVar3;
  storage_type *psVar4;
  error_code eVar5;
  
  if ((Other->field_0x10 & 1) == 0) {
    this[0x10] = (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  )((byte)this[0x10] & 0xfe);
    psVar3 = ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
             ::getStorage((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                           *)this);
    psVar4 = ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             ::getStorage(Other);
    pMVar1 = &((psVar4->_M_t).
               super___uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
               .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl)->
              super_MemoryBuffer;
    (psVar4->_M_t).
    super___uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
    ._M_t.
    super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
    .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl =
         (WritableMemoryBuffer *)0x0;
    (psVar3->_M_t).
    super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
    super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
    super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = pMVar1;
  }
  else {
    this[0x10] = (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  )((byte)this[0x10] | 1);
    peVar2 = ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
             ::getErrorStorage((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                                *)this);
    eVar5 = ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
            ::getError(Other);
    peVar2->_M_value = eVar5._M_value;
    peVar2->_M_cat = eVar5._M_cat;
  }
  return;
}

Assistant:

void moveConstruct(ErrorOr<OtherT> &&Other) {
    if (!Other.HasError) {
      // Get the other value.
      HasError = false;
      new (getStorage()) storage_type(std::move(*Other.getStorage()));
    } else {
      // Get other's error.
      HasError = true;
      new (getErrorStorage()) std::error_code(Other.getError());
    }
  }